

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O3

char * bcf_sr_strerror(int errnum)

{
  int *piVar1;
  char *pcVar2;
  
  switch(errnum) {
  case 0:
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    return pcVar2;
  case 1:
    return "not compressed with bgzip";
  case 2:
    return "could not load index";
  case 3:
    return "unknown file type";
  case 4:
    return "API usage error";
  case 5:
    return "could not parse header";
  default:
    return "";
  }
}

Assistant:

char *bcf_sr_strerror(int errnum)
{
    switch (errnum)
    {
        case open_failed: 
            return strerror(errno); break;
        case not_bgzf:
            return "not compressed with bgzip"; break;
        case idx_load_failed:
            return "could not load index"; break;
        case file_type_error:
            return "unknown file type"; break;
        case api_usage_error:
            return "API usage error"; break;
        case header_error:
            return "could not parse header"; break;
        default: return ""; 
    }
}